

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

int __thiscall
icu_63::KeywordEnumeration::clone
          (KeywordEnumeration *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  KeywordEnumeration *this_00;
  KeywordEnumeration *local_30;
  UErrorCode local_14;
  KeywordEnumeration *pKStack_10;
  UErrorCode status;
  KeywordEnumeration *this_local;
  
  local_14 = U_ZERO_ERROR;
  pKStack_10 = this;
  this_00 = (KeywordEnumeration *)UMemory::operator_new((UMemory *)0xd0,(size_t)__fn);
  local_30 = (KeywordEnumeration *)0x0;
  if (this_00 != (KeywordEnumeration *)0x0) {
    KeywordEnumeration(this_00,this->keywords,this->length,
                       *(int *)&this->current - (int)this->keywords,&local_14);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

virtual StringEnumeration * clone() const
    {
        UErrorCode status = U_ZERO_ERROR;
        return new KeywordEnumeration(keywords, length, (int32_t)(current - keywords), status);
    }